

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters ZVar1;
  void *__dest;
  size_t sVar2;
  ZSTD_CCtx_params params;
  
  ZVar1 = cParams;
  (cdict->matchState).cParams.searchLog = (int)cParams._12_8_;
  (cdict->matchState).cParams.minMatch = (int)((ulong)cParams._12_8_ >> 0x20);
  (cdict->matchState).cParams.targetLength = cParams.targetLength;
  (cdict->matchState).cParams.strategy = cParams.strategy;
  (cdict->matchState).cParams.windowLog = cParams.windowLog;
  (cdict->matchState).cParams.chainLog = cParams.chainLog;
  (cdict->matchState).cParams.hashLog = (int)ZVar1._8_8_;
  (cdict->matchState).cParams.searchLog = (int)((ulong)ZVar1._8_8_ >> 0x20);
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictBuffer = (void *)0x0;
    cdict->dictContent = dictBuffer;
  }
  else {
    __dest = ZSTD_malloc(dictSize,cdict->customMem);
    cdict->dictBuffer = __dest;
    cdict->dictContent = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  ZSTD_reset_matchState
            (&cdict->matchState,(void *)((long)cdict->workspace + 0x1800),&cParams,ZSTDcrp_continue,
             0);
  params.customMem.customFree = (ZSTD_freeFunction)0x0;
  params.customMem.opaque = (void *)0x0;
  params.ldmParams.hashRateLog = 0;
  params.ldmParams.windowLog = 0;
  params.customMem.customAlloc = (ZSTD_allocFunction)0x0;
  params.ldmParams.enableLdm = 0;
  params.ldmParams.hashLog = 0;
  params.ldmParams.bucketSizeLog = 0;
  params.ldmParams.minMatchLength = 0;
  params.jobSize = 0;
  params.overlapLog = 0;
  params.rsyncable = 0;
  params.forceWindow = 0;
  params.attachDictPref = ZSTD_dictDefaultAttach;
  params.nbWorkers = 0;
  params._60_4_ = 0;
  params.format = ZSTD_f_zstd1;
  params.fParams.noDictIDFlag = 0;
  params.compressionLevel = 3;
  params.fParams.contentSizeFlag = 1;
  params.fParams.checksumFlag = 0;
  params.cParams.windowLog = cParams.windowLog;
  params.cParams.chainLog = cParams.chainLog;
  params.cParams.hashLog = cParams.hashLog;
  params.cParams.searchLog = cParams.searchLog;
  params.cParams.minMatch = cParams.minMatch;
  params.cParams.targetLength = cParams.targetLength;
  params.cParams.strategy = cParams.strategy;
  sVar2 = ZSTD_compress_insertDictionary
                    (&cdict->cBlockState,&cdict->matchState,&params,cdict->dictContent,
                     cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,cdict->workspace);
  if (sVar2 < 0xffffffffffffff89) {
    cdict->dictID = (U32)sVar2;
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->matchState.cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictBuffer = NULL;
        cdict->dictContent = dictBuffer;
    } else {
        void* const internalBuffer = ZSTD_malloc(dictSize, cdict->customMem);
        cdict->dictBuffer = internalBuffer;
        cdict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    {   void* const end = ZSTD_reset_matchState(
                &cdict->matchState,
                (U32*)cdict->workspace + HUF_WORKSPACE_SIZE_U32,
                &cParams, ZSTDcrp_continue, /* forCCtx */ 0);
        assert(end == (char*)cdict->workspace + cdict->workspaceSize);
        (void)end;
    }
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is <= 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, &params,
                    cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->workspace);
            if (ZSTD_isError(dictID)) return dictID;
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}